

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall tcu::MessageBuilder::MessageBuilder(MessageBuilder *this,MessageBuilder *other)

{
  string asStack_38 [32];
  
  this->m_log = other->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_str);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

MessageBuilder::MessageBuilder (const MessageBuilder& other)
	: m_log(other.m_log)
{
	m_str.str(other.m_str.str());
}